

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re.c
# Opt level: O0

int re_matchp(re_t pattern,char *text)

{
  char cVar1;
  int iVar2;
  int local_24;
  char *pcStack_20;
  int idx;
  char *text_local;
  re_t pattern_local;
  
  if (pattern != (re_t)0x0) {
    if (pattern->type == '\x02') {
      iVar2 = matchpattern(pattern + 1,text);
      if (iVar2 == 0) {
        return -1;
      }
      return 0;
    }
    local_24 = -1;
    pcStack_20 = text;
    do {
      local_24 = local_24 + 1;
      iVar2 = matchpattern(pattern,pcStack_20);
      if (iVar2 != 0) {
        if (*pcStack_20 != '\0') {
          return local_24;
        }
        return -1;
      }
      cVar1 = *pcStack_20;
      pcStack_20 = pcStack_20 + 1;
    } while (cVar1 != '\0');
  }
  return -1;
}

Assistant:

int re_matchp(re_t pattern, const char* text)
{
  if (pattern != 0)
  {
    if (pattern[0].type == BEGIN)
    {
      return ((matchpattern(&pattern[1], text)) ? 0 : -1);
    }
    else
    {
      int idx = -1;

      do
      {
        idx += 1;
        
        if (matchpattern(pattern, text))
        {
          if (text[0] == '\0')
            return -1;
        
          return idx;
        }
      }
      while (*text++ != '\0');
    }
  }
  return -1;
}